

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O0

void save_progs(FILE *fp,AREA_DATA_conflict *pArea)

{
  ulong uVar1;
  AREA_DATA_conflict *in_RSI;
  FILE *in_RDI;
  __type_conflict2 _Var2;
  ROOM_INDEX_DATA *pRoomIndex;
  OBJ_INDEX_DATA *pObjIndex;
  MOB_INDEX_DATA *mIndex;
  long iHash;
  ROOM_INDEX_DATA *local_30;
  OBJ_INDEX_DATA *local_28;
  MOB_INDEX_DATA *local_20;
  long local_18;
  
  fprintf(in_RDI,"#IMPROGS\n");
  uVar1 = in_RSI->progtypes[0];
  _Var2 = std::pow<int,int>(0,0x78d6a1);
  if ((uVar1 & (long)_Var2) != 0) {
    fprintf(in_RDI,"A pulse_prog %s\n",in_RSI->aprogs->pulse_name);
  }
  uVar1 = in_RSI->progtypes[0];
  _Var2 = std::pow<int,int>(0,0x78d700);
  if ((uVar1 & (long)_Var2) != 0) {
    fprintf(in_RDI,"A reset_prog %s\n",in_RSI->aprogs->reset_name);
  }
  uVar1 = in_RSI->progtypes[0];
  _Var2 = std::pow<int,int>(0,0x78d75c);
  if ((uVar1 & (long)_Var2) != 0) {
    fprintf(in_RDI,"A sun_prog %s\n",in_RSI->aprogs->sun_name);
  }
  uVar1 = in_RSI->progtypes[0];
  _Var2 = std::pow<int,int>(0,0x78d7bb);
  if ((uVar1 & (long)_Var2) != 0) {
    fprintf(in_RDI,"A tick_prog %s\n",in_RSI->aprogs->tick_name);
  }
  uVar1 = in_RSI->progtypes[0];
  _Var2 = std::pow<int,int>(0,0x78d81a);
  if ((uVar1 & (long)_Var2) != 0) {
    fprintf(in_RDI,"A aggress_prog %s\n",in_RSI->aprogs->aggress_name);
  }
  uVar1 = in_RSI->progtypes[0];
  _Var2 = std::pow<int,int>(0,0x78d879);
  if ((uVar1 & (long)_Var2) != 0) {
    fprintf(in_RDI,"A myell_prog %s\n",in_RSI->aprogs->myell_name);
  }
  for (local_18 = 0; local_18 < 0x400; local_18 = local_18 + 1) {
    for (local_30 = room_index_hash[local_18]; local_30 != (ROOM_INDEX_DATA *)0x0;
        local_30 = local_30->next) {
      if ((local_30->area == in_RSI) && (local_30 != (ROOM_INDEX_DATA *)0xfffffffffffffe80)) {
        uVar1 = local_30->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78d953);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"R %d pulse_prog %s\n",(ulong)(uint)(int)local_30->vnum,
                  local_30->rprogs->pulse_name);
        }
        uVar1 = local_30->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78d9c7);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"R %d entry_prog %s\n",(ulong)(uint)(int)local_30->vnum,
                  local_30->rprogs->entry_name);
        }
        uVar1 = local_30->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78da38);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"R %d move_prog %s\n",(ulong)(uint)(int)local_30->vnum,
                  local_30->rprogs->move_name);
        }
        uVar1 = local_30->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78daac);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"R %d drop_prog %s\n",(ulong)(uint)(int)local_30->vnum,
                  local_30->rprogs->drop_name);
        }
        uVar1 = local_30->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78db20);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"R %d speech_prog %s\n",(ulong)(uint)(int)local_30->vnum,
                  local_30->rprogs->speech_name);
        }
        uVar1 = local_30->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78db94);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"R %d open_prog %s\n",(ulong)(uint)(int)local_30->vnum,
                  local_30->rprogs->open_name);
        }
      }
    }
    for (local_20 = mob_index_hash[local_18]; local_20 != (MOB_INDEX_DATA *)0x0;
        local_20 = local_20->next) {
      if (((local_20->area == in_RSI) && (local_20 != (MOB_INDEX_DATA *)0xffffffffffffffc8)) &&
         (local_20 != (MOB_INDEX_DATA *)0xffffffffffffffc8)) {
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78dc90);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d bribe_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->bribe_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78dcfb);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d entry_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->entry_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78dd63);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d greet_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->greet_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78ddd1);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d give_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->give_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78de3f);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d fight_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->fight_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78dead);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d death_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->death_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78df1b);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d beat_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->beat_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78df89);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d pulse_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->pulse_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78dff7);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d speech_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->speech_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e065);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d attack_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->attack_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e0d0);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d move_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->move_name);
        }
        uVar1 = local_20->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e13e);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"M %d aggress_prog %s\n",(ulong)(uint)(int)local_20->vnum,
                  local_20->mprogs->aggress_name);
        }
      }
    }
  }
  for (local_18 = 0; local_18 < 0x400; local_18 = local_18 + 1) {
    for (local_28 = obj_index_hash[local_18]; local_28 != (OBJ_INDEX_DATA *)0x0;
        local_28 = local_28->next) {
      if ((local_28->area == in_RSI) && (local_28 != (OBJ_INDEX_DATA *)0xffffffffffffff08)) {
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e257);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d wear_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->wear_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e2cb);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d remove_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->remove_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e33c);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d drop_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->drop_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e3ad);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d sac_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->sac_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e41b);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d give_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->give_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e489);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d greet_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->greet_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e4f7);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d fight_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->fight_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e565);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d death_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->death_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e5d3);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d speech_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->speech_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e641);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d entry_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->entry_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e6af);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d get_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->get_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e71d);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d pulse_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->pulse_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e78b);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d invoke_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->invoke_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e7f9);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d verb_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->verb_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e867);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d sac_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->sac_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e8d5);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d look_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->look_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e943);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d open_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->open_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78e9b1);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d loot_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->loot_name);
        }
        uVar1 = local_28->progtypes[0];
        _Var2 = std::pow<int,int>(0,0x78ea1e);
        if ((uVar1 & (long)_Var2) != 0) {
          fprintf(in_RDI,"I %d hit_prog %s\n",(ulong)(uint)(int)local_28->vnum,
                  local_28->iprogs->hit_name);
        }
      }
    }
  }
  fprintf(in_RDI,"END\n");
  return;
}

Assistant:

void save_progs(FILE *fp, AREA_DATA *pArea)
{
	long iHash;
	MOB_INDEX_DATA *mIndex = nullptr;
	OBJ_INDEX_DATA *pObjIndex = nullptr;
	ROOM_INDEX_DATA *pRoomIndex = nullptr;

	fprintf(fp, "#IMPROGS\n");

	if (IS_SET(pArea->progtypes, APROG_PULSE))
		fprintf(fp, "A pulse_prog %s\n", pArea->aprogs->pulse_name);

	if (IS_SET(pArea->progtypes, APROG_RESET))
		fprintf(fp, "A reset_prog %s\n", pArea->aprogs->reset_name);

	if (IS_SET(pArea->progtypes, APROG_SUN))
		fprintf(fp, "A sun_prog %s\n", pArea->aprogs->sun_name);

	if (IS_SET(pArea->progtypes, APROG_TICK))
		fprintf(fp, "A tick_prog %s\n", pArea->aprogs->tick_name);

	if (IS_SET(pArea->progtypes, APROG_AGGRESS))
		fprintf(fp, "A aggress_prog %s\n", pArea->aprogs->aggress_name);

	if (IS_SET(pArea->progtypes, APROG_MYELL))
		fprintf(fp, "A myell_prog %s\n", pArea->aprogs->myell_name);

	for (iHash = 0; iHash < MAX_KEY_HASH; iHash++)
	{
		for (pRoomIndex = room_index_hash[iHash]; pRoomIndex; pRoomIndex = pRoomIndex->next)
		{
			if (pRoomIndex->area != pArea)
				continue;

			if (pRoomIndex->progtypes)
			{
				if (IS_SET(pRoomIndex->progtypes, RPROG_PULSE))
					fprintf(fp, "R %d pulse_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->pulse_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_ENTRY))
					fprintf(fp, "R %d entry_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->entry_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_MOVE))
					fprintf(fp, "R %d move_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->move_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_DROP))
					fprintf(fp, "R %d drop_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->drop_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_SPEECH))
					fprintf(fp, "R %d speech_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->speech_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_OPEN))
					fprintf(fp, "R %d open_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->open_name);
			}
		}

		for (mIndex = mob_index_hash[iHash]; mIndex; mIndex = mIndex->next)
		{
			if (mIndex->area != pArea)
				continue;

			if (!mIndex->progtypes)
				continue;
			if (mIndex->progtypes)
			{
				if (IS_SET(mIndex->progtypes, MPROG_BRIBE))
					fprintf(fp, "M %d bribe_prog %s\n", mIndex->vnum, mIndex->mprogs->bribe_name);

				if (IS_SET(mIndex->progtypes, MPROG_ENTRY))
					fprintf(fp, "M %d entry_prog %s\n", mIndex->vnum, mIndex->mprogs->entry_name);

				if (IS_SET(mIndex->progtypes, MPROG_GREET))
					fprintf(fp, "M %d greet_prog %s\n", mIndex->vnum, mIndex->mprogs->greet_name);

				if (IS_SET(mIndex->progtypes, MPROG_GIVE))
					fprintf(fp, "M %d give_prog %s\n", mIndex->vnum, mIndex->mprogs->give_name);

				if (IS_SET(mIndex->progtypes, MPROG_FIGHT))
					fprintf(fp, "M %d fight_prog %s\n", mIndex->vnum, mIndex->mprogs->fight_name);

				if (IS_SET(mIndex->progtypes, MPROG_DEATH))
					fprintf(fp, "M %d death_prog %s\n", mIndex->vnum, mIndex->mprogs->death_name);

				if (IS_SET(mIndex->progtypes, MPROG_BEAT))
					fprintf(fp, "M %d beat_prog %s\n", mIndex->vnum, mIndex->mprogs->beat_name);

				if (IS_SET(mIndex->progtypes, MPROG_PULSE))
					fprintf(fp, "M %d pulse_prog %s\n", mIndex->vnum, mIndex->mprogs->pulse_name);

				if (IS_SET(mIndex->progtypes, MPROG_SPEECH))
					fprintf(fp, "M %d speech_prog %s\n", mIndex->vnum, mIndex->mprogs->speech_name);

				if (IS_SET(mIndex->progtypes, MPROG_ATTACK))
					fprintf(fp, "M %d attack_prog %s\n", mIndex->vnum, mIndex->mprogs->attack_name);

				if (IS_SET(mIndex->progtypes, MPROG_MOVE))
					fprintf(fp, "M %d move_prog %s\n", mIndex->vnum, mIndex->mprogs->move_name);

				if (IS_SET(mIndex->progtypes, MPROG_AGGRESS))
					fprintf(fp, "M %d aggress_prog %s\n", mIndex->vnum, mIndex->mprogs->aggress_name);
			}
		}
	}

	for (iHash = 0; iHash < MAX_KEY_HASH; iHash++)
	{
		for (pObjIndex = obj_index_hash[iHash]; pObjIndex; pObjIndex = pObjIndex->next)
		{
			if (pObjIndex->area != pArea || !pObjIndex->progtypes)
				continue;

			if (IS_SET(pObjIndex->progtypes, IPROG_WEAR))
				fprintf(fp, "I %d wear_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->wear_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_REMOVE))
				fprintf(fp, "I %d remove_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->remove_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_DROP))
				fprintf(fp, "I %d drop_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->drop_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_SAC))
				fprintf(fp, "I %d sac_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->sac_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_GIVE))
				fprintf(fp, "I %d give_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->give_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_GREET))
				fprintf(fp, "I %d greet_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->greet_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_FIGHT))
				fprintf(fp, "I %d fight_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->fight_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_DEATH))
				fprintf(fp, "I %d death_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->death_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_SPEECH))
				fprintf(fp, "I %d speech_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->speech_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_ENTRY))
				fprintf(fp, "I %d entry_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->entry_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_GET))
				fprintf(fp, "I %d get_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->get_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_PULSE))
				fprintf(fp, "I %d pulse_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->pulse_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_INVOKE))
				fprintf(fp, "I %d invoke_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->invoke_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_VERB))
				fprintf(fp, "I %d verb_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->verb_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_SAC))
				fprintf(fp, "I %d sac_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->sac_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_LOOK))
				fprintf(fp, "I %d look_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->look_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_OPEN))
				fprintf(fp, "I %d open_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->open_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_LOOT))
				fprintf(fp, "I %d loot_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->loot_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_HIT))
				fprintf(fp, "I %d hit_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->hit_name);
		}
	}

	fprintf(fp, "END\n");
}